

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::Assembler::embedConstPool(Assembler *this,Label *label,ConstPool *pool)

{
  bool bVar1;
  Error EVar2;
  Error EVar3;
  ConstPool *in_RDX;
  CodeBuffer *in_RSI;
  CodeHolder *in_RDI;
  uint8_t *p;
  Error err;
  size_t size;
  Error _err_1;
  Error _err;
  size_t in_stack_00000040;
  void *in_stack_00000048;
  Logger *in_stack_00000050;
  undefined4 in_stack_ffffffffffffff98;
  ulong uVar4;
  CodeHolder *this_00;
  Error local_38;
  
  if (*(Error *)((long)&in_RDI->_logger + 4) == 0) {
    this_00 = in_RDI;
    bVar1 = CodeEmitter::isLabelValid((CodeEmitter *)in_RDI,*(uint32_t *)((long)&in_RSI->_data + 4))
    ;
    if (bVar1) {
      EVar2 = (*(*(_func_int ***)&in_RDI->_codeInfo)[10])(in_RDI,1,in_RDX->_alignment & 0xffffffff);
      local_38 = EVar2;
      if ((EVar2 == 0) &&
         (local_38 = (*(*(_func_int ***)&in_RDI->_codeInfo)[9])(in_RDI,in_RSI), local_38 == 0)) {
        uVar4 = in_RDX->_size;
        if (((ulong)((long)(in_RDI->_baseHeap)._slots[0] - (long)(in_RDI->_baseHeap)._slots[1]) <
             uVar4) && (EVar3 = CodeHolder::growBuffer(this_00,in_RSI,(size_t)in_RDX), EVar3 != 0))
        {
          local_38 = CodeEmitter::setLastError
                               ((CodeEmitter *)CONCAT44(EVar2,local_38),(Error)(uVar4 >> 0x20),
                                (char *)CONCAT44(EVar3,in_stack_ffffffffffffff98));
        }
        else {
          ConstPool::fill(in_RDX,(void *)CONCAT44(EVar2,local_38));
          if ((in_RDI->_unresolvedLabelsCount & 4) != 0) {
            Logger::logBinary(in_stack_00000050,in_stack_00000048,in_stack_00000040);
          }
          (in_RDI->_baseHeap)._slots[1] =
               (Slot *)((long)&(in_RDI->_baseHeap)._slots[1]->next + uVar4);
          local_38 = 0;
        }
      }
    }
    else {
      local_38 = 0xc;
    }
  }
  else {
    local_38 = *(Error *)((long)&in_RDI->_logger + 4);
  }
  return local_38;
}

Assistant:

Error Assembler::embedConstPool(const Label& label, const ConstPool& pool) {
  if (_lastError) return _lastError;

  if (!isLabelValid(label))
    return DebugUtils::errored(kErrorInvalidLabel);

  ASMJIT_PROPAGATE(align(kAlignData, static_cast<uint32_t>(pool.getAlignment())));
  ASMJIT_PROPAGATE(bind(label));

  size_t size = pool.getSize();
  if (getRemainingSpace() < size) {
    Error err = _code->growBuffer(&_section->_buffer, size);
    if (ASMJIT_UNLIKELY(err)) return setLastError(err);
  }

  uint8_t* p = _bufferPtr;
  pool.fill(p);

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logBinary(p, size);
#endif // !ASMJIT_DISABLE_LOGGING

  _bufferPtr += size;
  return kErrorOk;
}